

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O1

bool __thiscall hwtest::pgraph::MthdKelvinFdBeginPatchD::is_valid_val(MthdKelvinFdBeginPatchD *this)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  bVar3 = true;
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
      chipset.card_type == 0x20) {
    uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
    bVar3 = false;
    if (((uVar1 & 7) != 4) && (bVar3 = false, (uVar1 & 7) != 7)) {
      uVar2 = uVar1 >> 3 & 7;
      bVar3 = false;
      if ((uVar2 != 4) && (uVar2 != 7)) {
        if ((uVar1 & 0x3c0) == 0) {
          return false;
        }
        bVar3 = (uVar1 & 0xfe0000) == 0;
      }
    }
  }
  return bVar3;
}

Assistant:

bool is_valid_val() override {
		if (chipset.card_type != 0x20)
			return true;
		int unk0 = extr(val, 0, 3);
		int unk3 = extr(val, 3, 3);
		int unk6 = extr(val, 6, 4);
		if (unk0 == 4 || unk0 == 7)
			return false;
		if (unk3 == 4 || unk3 == 7)
			return false;
		if (!unk6)
			return false;
		if (extr(val, 17, 7))
			return false;
		return true;
	}